

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_encoder.h
# Opt level: O3

void __thiscall
draco::DynamicIntegerPointsKdTreeEncoder<6>::
EncodeInternal<draco::PointDVector<unsigned_int>::PointDVectorIterator>
          (DynamicIntegerPointsKdTreeEncoder<6> *this,PointDVectorIterator begin,
          PointDVectorIterator end)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  pointer pvVar4;
  void *pvVar5;
  pointer puVar6;
  EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> *pEVar7;
  uint32_t *puVar8;
  uint *puVar9;
  long lVar10;
  PointDVector<unsigned_int> *pPVar11;
  PointDVectorIterator PVar12;
  PointDVectorIterator PVar13;
  long lVar14;
  uint32_t uVar15;
  uint uVar16;
  ulong uVar17;
  size_t sVar18;
  _Elt_pointer pEVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  VectorUint32 *levels;
  uint uVar24;
  size_t sVar25;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar26;
  ulong uVar27;
  bool bVar28;
  PointDVectorIterator split;
  stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
  status_stack;
  int local_150;
  undefined4 uStack_14c;
  PointDVector<unsigned_int> *pPStack_148;
  uint32_t local_140;
  undefined4 uStack_13c;
  EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> local_138;
  _Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
  local_f8;
  EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> local_a8;
  DirectBitEncoder *local_60;
  FoldedBit32Encoder<draco::RAnsBitEncoder> *local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  PointDVector<unsigned_int> *local_38;
  
  PVar13 = end;
  PVar12 = begin;
  local_a8.begin.item_ = local_a8.begin.item_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8,
             (ulong)this->dimension_,(value_type_conflict5 *)&local_a8,(allocator_type *)&local_138)
  ;
  pvVar4 = (this->base_stack_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = *(pointer *)
            ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data + 0x10);
  *(_Map_pointer *)
   &(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data = local_f8._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 8) = local_f8._M_impl.super__Deque_impl_data._M_map_size;
  *(_Elt_pointer *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 0x10) = local_f8._M_impl.super__Deque_impl_data._M_start._M_cur
  ;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((pvVar5 != (void *)0x0) &&
     (operator_delete(pvVar5,(long)puVar6 - (long)pvVar5),
     local_f8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0)) {
    operator_delete(local_f8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_f8._M_impl.super__Deque_impl_data._M_map);
  }
  local_a8.begin.item_ = local_a8.begin.item_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8,
             (ulong)this->dimension_,(value_type_conflict5 *)&local_a8,(allocator_type *)&local_138)
  ;
  pvVar4 = (this->levels_stack_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = *(pointer *)
            ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data + 0x10);
  *(_Map_pointer *)
   &(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data = local_f8._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 8) = local_f8._M_impl.super__Deque_impl_data._M_map_size;
  *(_Elt_pointer *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 0x10) = local_f8._M_impl.super__Deque_impl_data._M_start._M_cur
  ;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((pvVar5 != (void *)0x0) &&
     (operator_delete(pvVar5,(long)puVar6 - (long)pvVar5),
     local_f8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0)) {
    operator_delete(local_f8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_f8._M_impl.super__Deque_impl_data._M_map);
  }
  local_a8.begin.dimensionality_ = begin.dimensionality_;
  local_a8.begin._20_4_ = begin._20_4_;
  local_a8.begin.item_ = PVar12.item_;
  pPVar11 = PVar12.vec_;
  local_a8.end.item_ = end.item_;
  sVar18 = local_a8.end.item_;
  local_a8.end.vec_ = end.vec_;
  local_a8.end.dimensionality_ = end.dimensionality_;
  local_a8.end._20_4_ = end._20_4_;
  local_a8.last_axis = 0;
  local_a8.stack_pos = 0;
  local_a8.end.item_._0_4_ = (int)PVar13.item_;
  local_a8.num_remaining_points = (int)local_a8.end.item_ - (int)begin.item_;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a8.begin.vec_ = pPVar11;
  local_a8.end.item_ = sVar18;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
  ::_M_initialize_map(&local_f8,0);
  if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
    ::
    _M_push_back_aux<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>const&>
              ((deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
                *)&local_f8,&local_a8);
  }
  else {
    (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->last_axis = local_a8.last_axis;
    (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->num_remaining_points =
         local_a8.num_remaining_points;
    *(ulong *)&(local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->stack_pos =
         CONCAT44(local_a8._60_4_,local_a8.stack_pos);
    ((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).vec_ = local_a8.end.vec_;
    ((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).dimensionality_ =
         local_a8.end.dimensionality_;
    *(undefined4 *)&((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).field_0x14 =
         local_a8.end._20_4_;
    ((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).dimensionality_ =
         local_a8.begin.dimensionality_;
    *(undefined4 *)&((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).field_0x14 =
         local_a8.begin._20_4_;
    ((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).item_ = local_a8.end.item_;
    ((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).item_ = local_a8.begin.item_
    ;
    ((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).vec_ = local_a8.begin.vec_;
    local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_60 = &this->half_encoder_;
    local_58 = &this->numbers_encoder_;
    local_38 = pPVar11;
    do {
      if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pEVar7 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        sVar18 = pEVar7[7].begin.item_;
        sVar25 = pEVar7[7].end.item_;
        uVar15 = pEVar7[7].last_axis;
        uVar1 = pEVar7[7].stack_pos;
        operator_delete(local_f8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_f8._M_impl.super__Deque_impl_data._M_finish._M_first + 8;
        pEVar19 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_first + 7;
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        pEVar19 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        sVar18 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].begin.item_;
        sVar25 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].end.item_;
        uVar15 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].last_axis;
        uVar1 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].stack_pos;
      }
      local_40 = (ulong)uVar1;
      begin.item_._0_4_ = (int)sVar18;
      pvVar26 = (this->base_stack_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + local_40;
      levels = (this->levels_stack_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_40;
      PVar12.vec_._0_4_ = begin.vec_._0_4_;
      PVar12.item_ = sVar18;
      PVar12.vec_._4_4_ = begin.vec_._4_4_;
      PVar12.dimensionality_ = begin.dimensionality_;
      PVar12._20_4_ = begin._20_4_;
      PVar13.vec_ = end.vec_;
      PVar13.item_ = sVar25;
      PVar13.dimensionality_ = end.dimensionality_;
      PVar13._20_4_ = end._20_4_;
      local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = pEVar19;
      uVar15 = GetAndEncodeAxis<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                         (this,PVar12,PVar13,pvVar26,levels,uVar15);
      uVar17 = (ulong)uVar15;
      uVar2 = (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar17];
      uVar3 = this->bit_length_;
      if (uVar3 != uVar2) {
        uVar16 = (uint)(sVar25 - sVar18);
        if (uVar16 < 3) {
          puVar8 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          *puVar8 = uVar15;
          uVar17 = (ulong)this->dimension_;
          if (1 < this->dimension_) {
            uVar20 = 1;
            do {
              bVar28 = uVar15 == (int)uVar17 - 1U;
              uVar15 = uVar15 + 1;
              if (bVar28) {
                uVar15 = 0;
              }
              puVar8[uVar20] = uVar15;
              uVar20 = uVar20 + 1;
              uVar17 = (ulong)this->dimension_;
            } while (uVar20 < uVar17);
          }
          if (uVar16 != 0) {
            uVar27 = 0;
            uVar20 = uVar17;
            do {
              if ((int)uVar20 == 0) {
                uVar20 = 0;
              }
              else {
                uVar1 = local_38->dimensionality_;
                puVar9 = local_38->data0_;
                uVar22 = 0;
                do {
                  uVar20 = (ulong)(this->axes_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar22];
                  iVar23 = this->bit_length_ -
                           (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data._M_start[uVar20];
                  if (iVar23 != 0) {
                    DirectBitEncoder::EncodeLeastSignificantBits32
                              (&this->remaining_bits_encoder_,iVar23,
                               puVar9[(ulong)uVar1 * (sVar18 + uVar27) + uVar20]);
                    uVar17 = (ulong)this->dimension_;
                  }
                  uVar22 = uVar22 + 1;
                  uVar20 = uVar17;
                } while (uVar22 < uVar17);
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != (uVar16 & 3));
          }
        }
        else {
          local_50 = (ulong)(uVar1 + 1);
          local_48 = local_50 * 3;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((this->base_stack_).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_50,pvVar26);
          lVar14 = local_48;
          lVar10 = *(long *)((long)&(((this->base_stack_).
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data + local_48 * 8);
          iVar23 = (1 << ((char)uVar3 + ~(byte)uVar2 & 0x1f)) + *(int *)(lVar10 + uVar17 * 4);
          *(int *)(lVar10 + uVar17 * 4) = iVar23;
          std::
          __partition<draco::PointDVector<unsigned_int>::PointDVectorIterator,draco::DynamicIntegerPointsKdTreeEncoder<6>::Splitter>
                    (&local_150,CONCAT44(iVar23,uVar15));
          uVar24 = (int)sVar25 - local_150;
          uVar21 = local_150 - (int)begin.item_;
          if (uVar21 != uVar24) {
            DirectBitEncoder::EncodeBit(local_60,uVar21 < uVar24);
          }
          iVar23 = 0x1f;
          if (uVar16 != 0) {
            for (; uVar16 >> iVar23 == 0; iVar23 = iVar23 + -1) {
            }
          }
          if (uVar21 < uVar24) {
            uVar24 = uVar21;
          }
          FoldedBit32Encoder<draco::RAnsBitEncoder>::EncodeLeastSignificantBits32
                    (local_58,iVar23,((uint)(sVar25 - sVar18 >> 1) & 0x7fffffff) - uVar24);
          pvVar4 = (this->levels_stack_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar26 = pvVar4 + local_40;
          puVar6 = (pvVar26->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start + uVar17;
          *puVar6 = *puVar6 + 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)&(pvVar4->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data + lVar14 * 8),pvVar26);
          if (CONCAT44(uStack_14c,local_150) != sVar18) {
            local_138.begin.dimensionality_ = begin.dimensionality_;
            local_138.begin._20_4_ = begin._20_4_;
            local_138.end.dimensionality_ = local_140;
            local_138.end._20_4_ = uStack_13c;
            local_138.end.item_ = CONCAT44(uStack_14c,local_150);
            local_138.end.vec_ = pPStack_148;
            local_138.num_remaining_points = local_150 - (int)begin.item_;
            local_138.begin.item_ = sVar18;
            local_138.begin.vec_ = pPVar11;
            local_138.last_axis = uVar15;
            local_138.stack_pos = uVar1;
            std::
            deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
            ::
            emplace_back<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>
                      ((deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
                        *)&local_f8,&local_138);
            sVar18 = CONCAT44(uStack_14c,local_150);
          }
          if (sVar18 != sVar25) {
            local_138.begin.dimensionality_ = local_140;
            local_138.begin._20_4_ = uStack_13c;
            local_138.begin.item_ = CONCAT44(uStack_14c,local_150);
            local_138.begin.vec_ = pPStack_148;
            local_138.end.dimensionality_ = end.dimensionality_;
            local_138.end._20_4_ = end._20_4_;
            local_138.end.vec_ = end.vec_;
            local_138.stack_pos = (uint32_t)local_50;
            local_138.num_remaining_points = (int)sVar25 - local_150;
            local_138.end.item_ = sVar25;
            local_138.last_axis = uVar15;
            std::
            deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
            ::
            emplace_back<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>
                      ((deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
                        *)&local_f8,&local_138);
          }
        }
      }
    } while (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_f8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
  ::~_Deque_base(&local_f8);
  return;
}

Assistant:

void DynamicIntegerPointsKdTreeEncoder<compression_level_t>::EncodeInternal(
    RandomAccessIteratorT begin, RandomAccessIteratorT end) {
  typedef EncodingStatus<RandomAccessIteratorT> Status;

  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  Status init_status(begin, end, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    Status status = status_stack.top();
    status_stack.pop();

    begin = status.begin;
    end = status.end;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    const uint32_t axis =
        GetAndEncodeAxis(begin, end, old_base, levels, last_axis);
    const uint32_t level = levels[axis];
    const uint32_t num_remaining_points = static_cast<uint32_t>(end - begin);

    // If this happens all axis are subdivided to the end.
    if ((bit_length_ - level) == 0) {
      continue;
    }

    // Fast encoding of remaining bits if number of points is 1 or 2.
    // Doing this also for 2 gives a slight additional speed up.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        const auto &p = *(begin + i);
        for (uint32_t j = 0; j < dimension_; j++) {
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            remaining_bits_encoder_.EncodeLeastSignificantBits32(
                num_remaining_bits, p[axes_[j]]);
          }
        }
      }
      continue;
    }

    const uint32_t num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;  // copy
    base_stack_[stack_pos + 1][axis] += modifier;
    const VectorUint32 &new_base = base_stack_[stack_pos + 1];

    const RandomAccessIteratorT split =
        std::partition(begin, end, Splitter(axis, new_base[axis]));

    DRACO_DCHECK_EQ(true, (end - begin) > 0);

    // Encode number of points in first and second half.
    const int required_bits = MostSignificantBit(num_remaining_points);

    const uint32_t first_half = static_cast<uint32_t>(split - begin);
    const uint32_t second_half = static_cast<uint32_t>(end - split);
    const bool left = first_half < second_half;

    if (first_half != second_half) {
      half_encoder_.EncodeBit(left);
    }

    if (left) {
      EncodeNumber(required_bits, num_remaining_points / 2 - first_half);
    } else {
      EncodeNumber(required_bits, num_remaining_points / 2 - second_half);
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (split != begin) {
      status_stack.push(Status(begin, split, axis, stack_pos));
    }
    if (split != end) {
      status_stack.push(Status(split, end, axis, stack_pos + 1));
    }
  }
}